

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O2

void P_SpawnSlopeMakers(FMapThing *firstmt,FMapThing *lastmt,int *oldvertextable)

{
  double *pdVar1;
  ushort uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  FDoomEdEntry *pFVar6;
  vertex_t *pvVar7;
  line_t_conflict *plVar8;
  vertex_t *pvVar9;
  undefined1 auVar10 [16];
  double dVar11;
  bool bVar12;
  Node *pNVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  sector_t_conflict *psVar17;
  Node *pNVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  secplane_t *psVar23;
  bool bVar24;
  FMapThing *pFVar25;
  int i;
  long lVar26;
  ulong uVar27;
  TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *pTVar28;
  ulong uVar29;
  vertex_t *pvVar30;
  long lVar31;
  line_t_conflict *plVar32;
  int i_1;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  double in_XMM3_Qa;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  double dVar45;
  double dVar46;
  undefined4 local_198;
  double local_188;
  TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> vt_heights [2];
  double local_118;
  FLineIdIterator itr;
  DVector3 local_f8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  int *local_b8;
  double dStack_b0;
  DVector2 local_a8;
  undefined1 local_98 [16];
  long local_80;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  pFVar25 = firstmt;
  local_b8 = oldvertextable;
  do {
    if (lastmt <= pFVar25) {
      for (pFVar25 = firstmt; pFVar25 < lastmt; pFVar25 = pFVar25 + 1) {
        pFVar6 = pFVar25->info;
        if (((pFVar6 != (FDoomEdEntry *)0x0) && (pFVar6->Type == (PClassActor *)0x0)) &&
           (uVar4 = pFVar6->Special, (ushort)(uVar4 - 0x15) < 2)) {
          iVar15 = pFVar25->args[0];
          vt_heights[0].Nodes = (Node *)(pFVar25->pos).X;
          vt_heights[0].LastFree = (Node *)(pFVar25->pos).Y;
          psVar17 = P_PointInSector((DVector2 *)vt_heights);
          P_CopyPlane(iVar15,psVar17,uVar4 == 0x16);
          pFVar25->EdNum = 0;
        }
      }
      TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::TMap(vt_heights);
      TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::TMap(vt_heights + 1);
      bVar24 = false;
      for (; firstmt < lastmt; firstmt = firstmt + 1) {
        pFVar6 = firstmt->info;
        if (((pFVar6 != (FDoomEdEntry *)0x0) && (pFVar6->Type == (PClassActor *)0x0)) &&
           (uVar5 = pFVar6->Special, (ushort)(uVar5 - 0x17) < 2)) {
          lVar31 = 8;
          for (lVar26 = 0; lVar26 < numvertexes; lVar26 = lVar26 + 1) {
            dVar36 = *(double *)((long)vertexes + lVar31 + -8);
            if ((dVar36 == (firstmt->pos).X) && (!NAN(dVar36) && !NAN((firstmt->pos).X))) {
              dVar36 = *(double *)((long)&(vertexes->p).X + lVar31);
              pdVar1 = &(firstmt->pos).Y;
              if ((dVar36 == *pdVar1) && (!NAN(dVar36) && !NAN(*pdVar1))) {
                dVar36 = (firstmt->pos).Z;
                pTVar28 = vt_heights + 1;
                if (firstmt->info->Special == 0x17) {
                  pTVar28 = vt_heights;
                }
                pNVar18 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::GetNode
                                    (pTVar28,(int)lVar26);
                (pNVar18->Pair).Value = dVar36;
                bVar24 = true;
              }
            }
            lVar31 = lVar31 + 0x10;
          }
          firstmt->EdNum = 0;
        }
      }
      lVar31 = 0;
      for (lVar26 = 0; lVar26 < numvertexdatas; lVar26 = lVar26 + 1) {
        if (local_b8 == (int *)0x0) {
          iVar15 = (int)lVar26;
        }
        else {
          iVar15 = local_b8[lVar26];
        }
        uVar14 = *(uint *)((long)&vertexdatas->flags + lVar31);
        if ((uVar14 & 1) != 0) {
          dVar36 = *(double *)((long)&vertexdatas->zCeiling + lVar31);
          pNVar18 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::GetNode
                              (vt_heights + 1,iVar15);
          (pNVar18->Pair).Value = dVar36;
          uVar14 = *(uint *)((long)&vertexdatas->flags + lVar31);
          bVar24 = true;
        }
        if ((uVar14 & 2) != 0) {
          dVar36 = *(double *)((long)&vertexdatas->zFloor + lVar31);
          pNVar18 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::GetNode
                              (vt_heights,iVar15);
          (pNVar18->Pair).Value = dVar36;
          bVar24 = true;
        }
        lVar31 = lVar31 + 0x18;
      }
      if (vertexdatas != (vertexdata_t *)0x0) {
        operator_delete__(vertexdatas);
      }
      vertexdatas = (vertexdata_t *)0x0;
      numvertexdatas = 0;
      if (bVar24) {
        lVar31 = 0;
        while (psVar17 = sectors, lVar31 < numsectors) {
          local_80 = lVar31;
          if (sectors[lVar31].linecount == 3) {
            plVar32 = *sectors[lVar31].lines;
            plVar8 = sectors[lVar31].lines[1];
            pvVar7 = plVar32->v1;
            pvVar9 = plVar32->v2;
            pvVar30 = plVar8->v1;
            if (pvVar30 == pvVar9 || pvVar30 == pvVar7) {
              pvVar30 = plVar8->v2;
            }
            uVar27 = (ulong)((long)pvVar7 - (long)vertexes) >> 4;
            uVar29 = (ulong)((long)pvVar9 - (long)vertexes) >> 4;
            local_c8._0_8_ = uVar27;
            local_98._0_8_ = uVar29;
            iVar15 = (int)((ulong)((long)pvVar30 - (long)vertexes) >> 4);
            local_a8 = vertexes[(int)uVar27].p;
            local_b8 = (int *)vertexes[(int)uVar29].p.X;
            dStack_b0 = vertexes[(int)uVar29].p.Y;
            dVar36 = vertexes[iVar15].p.X;
            dVar11 = vertexes[iVar15].p.Y;
            pdVar1 = &sectors[lVar31].planes[1].TexZ;
            pdVar19 = &sectors[lVar31].planes[0].TexZ;
            local_d8._8_8_ = local_b8;
            local_d8._0_8_ = in_XMM3_Qa;
            dStack_40 = local_a8.X;
            local_78._8_4_ = local_a8.Y._0_4_;
            local_78._0_8_ = local_a8.Y;
            local_78._12_4_ = local_a8.Y._4_4_;
            local_68 = dVar11;
            dStack_60 = dVar11;
            local_58 = dStack_b0;
            dStack_50 = dStack_b0;
            local_48 = in_XMM3_Qa;
            for (lVar26 = 0; lVar26 != 0x30; lVar26 = lVar26 + 0x18) {
              pTVar28 = (TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)
                        ((long)&vt_heights[0].Nodes + lVar26);
              pdVar20 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::CheckKey
                                  (pTVar28,local_c8._0_4_);
              pdVar21 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::CheckKey
                                  (pTVar28,local_98._0_4_);
              pdVar22 = TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::CheckKey
                                  (pTVar28,iVar15);
              if (((pdVar20 != (double *)0x0) || (pdVar21 != (double *)0x0)) ||
                 (pdVar22 != (double *)0x0)) {
                if (pdVar20 == (double *)0x0) {
                  if (lVar26 != 0) {
                    local_118 = *pdVar1;
                    uVar34 = SUB84(local_118,0);
                    uVar33 = (undefined4)((ulong)local_118 >> 0x20);
                    if (pdVar21 != (double *)0x0) {
                      uVar34 = SUB84(*pdVar21,0);
                      uVar33 = (undefined4)((ulong)*pdVar21 >> 0x20);
                    }
                    goto LAB_0044fe7a;
                  }
                  local_118 = *pdVar19;
                  uVar34 = SUB84(local_118,0);
                  uVar33 = (undefined4)((ulong)local_118 >> 0x20);
                  if (pdVar21 != (double *)0x0) {
                    uVar34 = SUB84(*pdVar21,0);
                    uVar33 = (undefined4)((ulong)*pdVar21 >> 0x20);
                  }
LAB_0044feb2:
                  local_188 = (double)CONCAT44(uVar33,uVar34);
                  if (pdVar22 == (double *)0x0) {
LAB_0044febc:
                    pdVar22 = pdVar19;
                  }
                }
                else {
                  local_118 = *pdVar20;
                  if (pdVar21 == (double *)0x0) {
                    if (lVar26 == 0) {
                      uVar34 = SUB84(*pdVar19,0);
                      uVar33 = (undefined4)((ulong)*pdVar19 >> 0x20);
                      goto LAB_0044feb2;
                    }
                    uVar34 = SUB84(*pdVar1,0);
                    uVar33 = (undefined4)((ulong)*pdVar1 >> 0x20);
LAB_0044fe7a:
                    local_188 = (double)CONCAT44(uVar33,uVar34);
                    if (pdVar22 != (double *)0x0) goto LAB_0044fec1;
                  }
                  else {
                    local_188 = *pdVar21;
                    if (pdVar22 != (double *)0x0) goto LAB_0044fec1;
                    if (lVar26 == 0) goto LAB_0044febc;
                  }
                  pdVar22 = pdVar1;
                }
LAB_0044fec1:
                dVar40 = *pdVar22;
                iVar16 = P_PointOnLineSidePrecise
                                   (vertexes[iVar15].p.X,vertexes[iVar15].p.Y,*psVar17[lVar31].lines
                                   );
                uVar34 = SUB84(local_118,0);
                uVar33 = (undefined4)((ulong)local_118 >> 0x20);
                dVar37 = local_58;
                if (iVar16 != 0) {
                  uVar34 = SUB84(local_188,0);
                  uVar33 = (undefined4)((ulong)local_188 >> 0x20);
                  dVar37 = (double)local_78._0_8_;
                }
                in_XMM3_Qa = (double)CONCAT44(uVar33,uVar34) - dVar40;
                uVar14 = (uint)(iVar16 == 0);
                auVar43._0_8_ =
                     CONCAT44((int)(uVar14 << 0x1f) >> 0x1f,(int)(uVar14 << 0x1f) >> 0x1f);
                auVar43._8_4_ = (int)(uVar14 << 0x1f) >> 0x1f;
                auVar43._12_4_ = (int)(uVar14 << 0x1f) >> 0x1f;
                auVar39._8_8_ = dStack_b0;
                auVar39._0_8_ = local_b8;
                auVar39 = (undefined1  [16])local_a8 & auVar43 | ~auVar43 & auVar39;
                dVar41 = (double)(~auVar43._0_8_ & (ulong)local_118 |
                                 (ulong)local_188 & auVar43._0_8_) - dVar40;
                dVar44 = (double)(~auVar43._8_8_ & (ulong)dStack_40 | local_d8._8_8_ & auVar43._8_8_
                                 ) - dVar36;
                dVar45 = auVar39._0_8_ - dVar36;
                dVar46 = auVar39._8_8_ - dVar11;
                local_f8.X = (dVar37 - local_68) * in_XMM3_Qa - dVar46 * dVar41;
                in_XMM3_Qa = dVar44 * in_XMM3_Qa;
                local_f8.Y = dVar45 * dVar41 - in_XMM3_Qa;
                local_f8.Z = dVar46 * dVar44 - (dVar37 - local_68) * dVar45;
                dVar37 = TVector3<double>::Length(&local_f8);
                if ((dVar37 != 0.0) || (NAN(dVar37))) {
                  dVar37 = 1.0 / dVar37;
                  dVar41 = dVar37 * local_f8.X;
                  dVar44 = dVar37 * local_f8.Y;
                  dVar37 = dVar37 * local_f8.Z;
                  if (((lVar26 == 0) && (dVar37 < 0.0)) || ((lVar26 == 0x18 && (0.0 < dVar37)))) {
                    dVar41 = -dVar41;
                    dVar44 = -dVar44;
                    dVar37 = -dVar37;
                  }
                  psVar23 = &psVar17[lVar31].ceilingplane;
                  if (lVar26 == 0) {
                    psVar23 = &psVar17[lVar31].floorplane;
                  }
                  dVar45 = vertexes[iVar15].p.X;
                  dVar46 = vertexes[iVar15].p.Y;
                  in_XMM3_Qa = dVar40 * dVar37;
                  auVar10._8_4_ = SUB84(dVar44,0);
                  auVar10._0_8_ = dVar41;
                  auVar10._12_4_ = (int)((ulong)dVar44 >> 0x20);
                  (psVar23->normal).X = dVar41;
                  (psVar23->normal).Y = (double)auVar10._8_8_;
                  (psVar23->normal).Z = dVar37;
                  psVar23->D = (-dVar41 * dVar45 - dVar44 * dVar46) - in_XMM3_Qa;
                  psVar23->negiC = -1.0 / dVar37;
                }
              }
            }
          }
          lVar31 = local_80 + 1;
        }
      }
      lVar31 = 0x18;
      do {
        TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_>::~TMap
                  ((TMap<int,_double,_THashTraits<int>,_TValueTraits<double>_> *)
                   ((long)&vt_heights[0].Nodes + lVar31));
        lVar31 = lVar31 + -0x18;
      } while (lVar31 != -0x18);
      return;
    }
    pFVar6 = pFVar25->info;
    if (((pFVar6 != (FDoomEdEntry *)0x0) && (pFVar6->Type == (PClassActor *)0x0)) &&
       (uVar3 = pFVar6->Special, (ushort)(uVar3 - 0xf) < 6)) {
      pNVar18 = (Node *)(pFVar25->pos).X;
      pNVar13 = (Node *)(pFVar25->pos).Y;
      local_198 = SUB84(pNVar18,0);
      vt_heights[0].Nodes = pNVar18;
      vt_heights[0].LastFree = pNVar13;
      local_f8.X = (double)pNVar18;
      local_f8.Y = (double)pNVar13;
      psVar17 = P_PointInSector((DVector2 *)vt_heights);
      uVar14 = (uint)(ushort)pFVar25->info->Special;
      if ((uVar14 < 0x15) && ((0x150000U >> (uVar14 & 0x1f) & 1) != 0)) {
        bVar24 = true;
        lVar31 = 0xd8;
      }
      else {
        lVar31 = 0xb0;
        bVar24 = false;
      }
      psVar23 = (secplane_t *)((long)&psVar17->planes[0].xform.xOffs + lVar31);
      vt_heights[0].Nodes = (Node *)(pFVar25->pos).X;
      vt_heights[0].LastFree = (Node *)(pFVar25->pos).Y;
      local_f8.Z = secplane_t::ZatPoint(psVar23,(DVector2 *)vt_heights);
      local_f8.Z = local_f8.Z + (pFVar25->pos).Z;
      local_c8._8_4_ = extraout_XMM0_Dc;
      local_c8._0_8_ = local_f8.Z;
      local_c8._12_4_ = extraout_XMM0_Dd;
      uVar2 = pFVar25->info->Special;
      if ((short)uVar2 < 0x11) {
        itr.searchtag = pFVar25->args[0];
        itr.start = tagManager.IDHashFirst[itr.searchtag & 0xff];
        lVar31 = 0xb0;
        if (bVar24 != false) {
          lVar31 = 0xd8;
        }
        uVar34 = (undefined4)((ulong)pNVar13 >> 0x20);
        local_d8._8_4_ = (int)pNVar13;
        local_d8._0_8_ = pNVar13;
        local_d8._12_4_ = uVar34;
        while (uVar14 = FLineIdIterator::Next(&itr), -1 < (int)uVar14) {
          plVar32 = lines + uVar14;
          vt_heights[0].Nodes = pNVar18;
          vt_heights[0].LastFree = pNVar13;
          iVar15 = P_PointOnLineSidePrecise((DVector2 *)vt_heights,plVar32);
          if (plVar32->bbox[(ulong)(iVar15 != 0) + 4] != 0.0) {
            pvVar7 = plVar32->v1;
            local_98._8_4_ = (int)pNVar13;
            local_98._0_8_ = (double)pNVar18 - (pvVar7->p).X;
            local_98._12_4_ = uVar34;
            psVar23 = (secplane_t *)((long)plVar32->bbox[(ulong)(iVar15 != 0) + 4] + lVar31);
            in_XMM3_Qa = local_d8._0_8_ - (pvVar7->p).Y;
            dVar11 = secplane_t::ZatPoint(psVar23,pvVar7);
            local_a8.Y = 0.0;
            local_a8.X = (plVar32->delta).X;
            dVar36 = (plVar32->delta).Y;
            dVar40 = secplane_t::ZatPoint(psVar23,plVar32->v2);
            vt_heights[0]._16_8_ = in_XMM3_Qa * local_a8.X - (double)local_98._0_8_ * dVar36;
            vt_heights[0].Nodes =
                 (Node *)(dVar36 * ((double)local_c8._0_8_ - dVar11) -
                         in_XMM3_Qa * (dVar40 - dVar11));
            vt_heights[0].LastFree =
                 (Node *)((double)local_98._0_8_ * (dVar40 - dVar11) -
                         local_a8.X * ((double)local_c8._0_8_ - dVar11));
            dVar36 = TVector3<double>::Length((TVector3<double> *)vt_heights);
            if ((dVar36 == 0.0) && (!NAN(dVar36))) {
              Printf("Slope thing at (%f,%f) lies directly on its target line.\n",local_198,
                     local_d8._0_8_);
              break;
            }
            dVar36 = 1.0 / dVar36;
            dVar40 = (double)vt_heights[0]._16_8_ * dVar36;
            dVar11 = -dVar40;
            uVar33 = SUB84(dVar40,0);
            uVar35 = (undefined4)((ulong)dVar11 >> 0x20);
            bVar12 = dVar40 < dVar11;
            if (bVar24 != false) {
              bVar12 = dVar11 < dVar40;
            }
            if (!bVar12) {
              uVar35 = (undefined4)((ulong)dVar40 >> 0x20);
            }
            auVar38._0_8_ = dVar36 * (double)vt_heights[0].Nodes;
            auVar38._8_8_ = dVar36 * (double)vt_heights[0].LastFree;
            auVar42._0_4_ = (int)((uint)bVar12 << 0x1f) >> 0x1f;
            auVar42._4_4_ = (int)((uint)bVar12 << 0x1f) >> 0x1f;
            auVar42._8_4_ = (int)((uint)bVar12 << 0x1f) >> 0x1f;
            auVar42._12_4_ = (int)((uint)bVar12 << 0x1f) >> 0x1f;
            auVar39 = (auVar38 ^ _DAT_005a5040) & auVar42 | ~auVar42 & auVar38;
            in_XMM3_Qa = ((double)(auVar39._0_8_ ^ (ulong)DAT_005a5040) * (double)pNVar18 -
                         (double)pNVar13 * auVar39._8_8_) -
                         (double)local_c8._0_8_ * (double)CONCAT44(uVar35,uVar33);
            (psVar23->normal).X = (double)auVar39._0_8_;
            (psVar23->normal).Y = (double)auVar39._8_8_;
            (psVar23->normal).Z = (double)CONCAT44(uVar35,uVar33);
            psVar23->D = in_XMM3_Qa;
            psVar23->negiC = -1.0 / (double)CONCAT44(uVar35,uVar33);
          }
        }
      }
      else if (uVar2 < 0x13) {
        P_SetSlope(psVar23,bVar24,(int)pFVar25->angle,pFVar25->args[0],&local_f8);
      }
      else {
        P_VavoomSlope(psVar17,pFVar25->thingid,&pFVar25->pos,(uint)bVar24);
      }
      pFVar25->EdNum = 0;
    }
    pFVar25 = pFVar25 + 1;
  } while( true );
}

Assistant:

void P_SpawnSlopeMakers (FMapThing *firstmt, FMapThing *lastmt, const int *oldvertextable)
{
	FMapThing *mt;

	for (mt = firstmt; mt < lastmt; ++mt)
	{
		if (mt->info != NULL && mt->info->Type == NULL &&
		   (mt->info->Special >= SMT_SlopeFloorPointLine && mt->info->Special <= SMT_VavoomCeiling))
		{
			DVector3 pos = mt->pos;
			secplane_t *refplane;
			sector_t *sec;
			bool ceiling;

			sec = P_PointInSector (mt->pos);
			if (mt->info->Special == SMT_SlopeCeilingPointLine || mt->info->Special == SMT_VavoomCeiling || mt->info->Special == SMT_SetCeilingSlope)
			{
				refplane = &sec->ceilingplane;
				ceiling = true;
			}
			else
			{
				refplane = &sec->floorplane;
				ceiling = false;
			}
			pos.Z = refplane->ZatPoint (mt->pos) + mt->pos.Z;

			if (mt->info->Special <= SMT_SlopeCeilingPointLine)
			{ // SlopeFloorPointLine and SlopCeilingPointLine
				P_SlopeLineToPoint (mt->args[0], pos, ceiling);
			}
			else if (mt->info->Special <= SMT_SetCeilingSlope)
			{ // SetFloorSlope and SetCeilingSlope
				P_SetSlope (refplane, ceiling, mt->angle, mt->args[0], pos);
			}
			else 
			{ // VavoomFloor and VavoomCeiling (these do not perform any sector height adjustment - z is absolute)
				P_VavoomSlope(sec, mt->thingid, mt->pos, ceiling); 
			}
			mt->EdNum = 0;
		}
	}

	for (mt = firstmt; mt < lastmt; ++mt)
	{
		if (mt->info != NULL && mt->info->Type == NULL &&
			(mt->info->Special == SMT_CopyFloorPlane || mt->info->Special == SMT_CopyCeilingPlane))
		{
			P_CopyPlane (mt->args[0], mt->pos, mt->info->Special == SMT_CopyCeilingPlane);
			mt->EdNum = 0;
		}
	}

	P_SetSlopesFromVertexHeights(firstmt, lastmt, oldvertextable);
}